

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StructSerializer.hpp
# Opt level: O3

void mserialize::
     StructSerializer<binlog::WriterProp,_std::integral_constant<unsigned_long_binlog::WriterProp::*,_&binlog::WriterProp::id>,_std::integral_constant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_binlog::WriterProp::*,_&binlog::WriterProp::name>,_std::integral_constant<unsigned_long_binlog::WriterProp::*,_&binlog::WriterProp::batchSize>_>
     ::serialize<binlog::detail::VectorOutputStream>(WriterProp *t,VectorOutputStream *ostream)

{
  uint64_t local_20;
  
  local_20 = t->id;
  std::vector<char,std::allocator<char>>::_M_range_insert<char_const*>
            ((vector<char,std::allocator<char>> *)ostream,
             (ostream->vector).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish,&local_20);
  detail::
  BuiltinSerializer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  ::serialize<binlog::detail::VectorOutputStream>(&t->name,ostream);
  local_20 = t->batchSize;
  std::vector<char,std::allocator<char>>::_M_range_insert<char_const*>
            ((vector<char,std::allocator<char>> *)ostream,
             (ostream->vector).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish,&local_20,&stack0xffffffffffffffe8);
  return;
}

Assistant:

static void serialize(const T& t, OutputStream& ostream)
  {
    using swallow = int[];
    (void)swallow{1, (serialize_member(t, Members::value, ostream), int{})...};
  }